

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticEmitterSystem.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,UnderwaterAcousticEmitterSystem *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer pUVar3;
  string local_220 [32];
  __normal_iterator<const_KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam_*,_std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>_>
  local_200;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  UnderwaterAcousticEmitterSystem *local_18;
  UnderwaterAcousticEmitterSystem *this_local;
  
  local_18 = this;
  this_local = (UnderwaterAcousticEmitterSystem *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar2 = std::operator<<(local_190,"Underwater Acoustic Emitter System:");
  poVar2 = std::operator<<(poVar2,"\n\tData Length:       ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8EmitterSystemDataLength);
  poVar2 = std::operator<<(poVar2,"\n\tNumber Of Beams:   ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8NumBeams);
  AcousticEmitterSystem::GetAsString_abi_cxx11_(&local_1d0,&this->m_AES);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d0);
  poVar2 = std::operator<<(poVar2,"\n\tLocation:          ");
  Vector::GetAsString_abi_cxx11_((KString *)&citr,&this->m_Location);
  std::operator<<(poVar2,(string *)&citr);
  std::__cxx11::string::~string((string *)&citr);
  std::__cxx11::string::~string((string *)&local_1d0);
  citrEnd = std::
            vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
            ::begin(&this->m_vUAEB);
  local_200._M_current =
       (UnderwaterAcousticEmitterBeam *)
       std::
       vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
       ::end(&this->m_vUAEB);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_200);
    if (!bVar1) break;
    pUVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam_*,_std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>_>
             ::operator->(&citrEnd);
    (*(pUVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(local_220);
    std::operator<<(local_190,local_220);
    std::__cxx11::string::~string(local_220);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam_*,_std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>_>
    ::operator++(&citrEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString UnderwaterAcousticEmitterSystem::GetAsString() const
{
    KStringStream ss;

    ss << "Underwater Acoustic Emitter System:"
       << "\n\tData Length:       " << ( KUINT16 )m_ui8EmitterSystemDataLength
       << "\n\tNumber Of Beams:   " << ( KUINT16 )m_ui8NumBeams
       << m_AES.GetAsString()
       << "\n\tLocation:          " << m_Location.GetAsString();

    vector<UnderwaterAcousticEmitterBeam>::const_iterator citr = m_vUAEB.begin();
    vector<UnderwaterAcousticEmitterBeam>::const_iterator citrEnd = m_vUAEB.end();

    for( ; citr != citrEnd; ++citr )
    {
        ss << citr->GetAsString();
    }

    return ss.str();
}